

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fake_plugin.cc
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this;
  CodeGeneratorResponse_File *pCVar2;
  string *str;
  uint32_t *puVar3;
  Arena *pAVar4;
  LogMessage *pLVar5;
  char *in_RCX;
  char *pcVar6;
  string_view src;
  LogMessage local_228;
  Voidify local_211;
  string local_210;
  undefined1 local_1f0 [16];
  string local_1e0;
  AlphaNum local_1c0;
  AlphaNum local_190;
  string local_160;
  undefined1 local_140 [8];
  CodeGeneratorResponse response;
  LogMessage local_f0;
  Voidify local_da;
  byte local_d9;
  LogMessage local_d8;
  Voidify local_c5 [13];
  undefined1 local_b8 [8];
  CodeGeneratorRequest request;
  char **argv_local;
  int argc_local;
  
  request.field_0._impl_.compiler_version_ = (Version *)argv;
  google::protobuf::compiler::CodeGeneratorRequest::CodeGeneratorRequest
            ((CodeGeneratorRequest *)local_b8);
  local_d9 = 0;
  bVar1 = google::protobuf::MessageLite::ParseFromFileDescriptor((MessageLite *)local_b8,0);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    in_RCX = "request.ParseFromFileDescriptor(STDIN_FILENO)";
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_d8,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/fake_plugin.cc"
               ,0x23,"request.ParseFromFileDescriptor(STDIN_FILENO)");
    local_d9 = 1;
    pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_d8);
    absl::lts_20250127::log_internal::Voidify::operator&&(local_c5,pLVar5);
  }
  if ((local_d9 & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_d8);
  }
  response.field_0._impl_.maximum_edition_._3_1_ = 0;
  this = google::protobuf::compiler::CodeGeneratorRequest::file_to_generate_abi_cxx11_
                   ((CodeGeneratorRequest *)local_b8);
  bVar1 = google::protobuf::
          RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::empty(this);
  if (bVar1) {
    in_RCX = "!request.file_to_generate().empty()";
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_f0,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/fake_plugin.cc"
               ,0x24,"!request.file_to_generate().empty()");
    response.field_0._impl_.maximum_edition_._3_1_ = 1;
    pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_f0);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_da,pLVar5);
  }
  if ((response.field_0._impl_.maximum_edition_._3_1_ & 1) == 0) {
    google::protobuf::compiler::CodeGeneratorResponse::CodeGeneratorResponse
              ((CodeGeneratorResponse *)local_140);
    google::protobuf::compiler::CodeGeneratorResponse::set_supported_features
              ((CodeGeneratorResponse *)local_140,2);
    google::protobuf::compiler::CodeGeneratorResponse::set_minimum_edition
              ((CodeGeneratorResponse *)local_140,0x3e6);
    google::protobuf::compiler::CodeGeneratorResponse::set_maximum_edition
              ((CodeGeneratorResponse *)local_140,0x7fffffff);
    pCVar2 = google::protobuf::compiler::CodeGeneratorResponse::add_file
                       ((CodeGeneratorResponse *)local_140);
    str = google::protobuf::compiler::CodeGeneratorRequest::file_to_generate_abi_cxx11_
                    ((CodeGeneratorRequest *)local_b8,0);
    absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_190,str);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_1c0,".request");
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_160,(lts_20250127 *)&local_190,&local_1c0,(AlphaNum *)in_RCX);
    puVar3 = google::protobuf::internal::HasBits<1>::operator[]
                       (&(pCVar2->field_0)._impl_._has_bits_,0);
    pcVar6 = (char *)(CONCAT71((int7)((ulong)in_RCX >> 8),(char)*puVar3) | 1);
    *(char *)puVar3 = (char)pcVar6;
    pAVar4 = google::protobuf::MessageLite::GetArena((MessageLite *)pCVar2);
    google::protobuf::internal::ArenaStringPtr::Set
              (&(pCVar2->field_0)._impl_.name_,&local_160,pAVar4);
    std::__cxx11::string::~string((string *)&local_160);
    pCVar2 = google::protobuf::compiler::CodeGeneratorResponse::mutable_file
                       ((CodeGeneratorResponse *)local_140,0);
    google::protobuf::MessageLite::SerializeAsString_abi_cxx11_(&local_210,(MessageLite *)local_b8);
    local_1f0 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_210);
    src._M_len = local_1f0._8_8_;
    src._M_str = pcVar6;
    absl::lts_20250127::Base64Escape_abi_cxx11_(&local_1e0,local_1f0._0_8_,src);
    puVar3 = google::protobuf::internal::HasBits<1>::operator[]
                       (&(pCVar2->field_0)._impl_._has_bits_,0);
    *(byte *)puVar3 = (byte)*puVar3 | 4;
    pAVar4 = google::protobuf::MessageLite::GetArena((MessageLite *)pCVar2);
    google::protobuf::internal::ArenaStringPtr::Set
              (&(pCVar2->field_0)._impl_.content_,&local_1e0,pAVar4);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::__cxx11::string::~string((string *)&local_210);
    bVar1 = google::protobuf::MessageLite::SerializeToFileDescriptor((MessageLite *)local_140,1);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_228,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/fake_plugin.cc"
                 ,0x2e,"response.SerializeToFileDescriptor(STDOUT_FILENO)");
      pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_228);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_211,pLVar5);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_228);
    }
    google::protobuf::compiler::CodeGeneratorResponse::~CodeGeneratorResponse
              ((CodeGeneratorResponse *)local_140);
    google::protobuf::compiler::CodeGeneratorRequest::~CodeGeneratorRequest
              ((CodeGeneratorRequest *)local_b8);
    return 0;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_f0);
}

Assistant:

int main(int argc, char* argv[]) {

#ifdef _WIN32
  google::protobuf::io::win32::setmode(STDIN_FILENO, _O_BINARY);
  google::protobuf::io::win32::setmode(STDOUT_FILENO, _O_BINARY);
#endif

  CodeGeneratorRequest request;
  ABSL_CHECK(request.ParseFromFileDescriptor(STDIN_FILENO));
  ABSL_CHECK(!request.file_to_generate().empty());
  CodeGeneratorResponse response;
  response.set_supported_features(
      CodeGeneratorResponse::FEATURE_SUPPORTS_EDITIONS);
  response.set_minimum_edition(google::protobuf::Edition::EDITION_PROTO2);
  response.set_maximum_edition(google::protobuf::Edition::EDITION_MAX);
  response.add_file()->set_name(
      absl::StrCat(request.file_to_generate(0), ".request"));
  response.mutable_file(0)->set_content(
      absl::Base64Escape(request.SerializeAsString()));
  ABSL_CHECK(response.SerializeToFileDescriptor(STDOUT_FILENO));
  return 0;
}